

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vfloat<4> vVar12;
  byte bVar13;
  BVH *bvh;
  void *pvVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  vbool<4> vVar28;
  char cVar29;
  bool bVar30;
  uint uVar31;
  undefined4 uVar32;
  int iVar33;
  AABBNodeMB4D *node1;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  NodeRef root;
  size_t sVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  NodeRef *pNVar39;
  vint4 ai_2;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  float fVar44;
  float fVar54;
  float fVar55;
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  float fVar57;
  float fVar64;
  float fVar65;
  vint4 ai_13;
  undefined1 auVar58 [16];
  float fVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 bi_3;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar90;
  float fVar91;
  float fVar92;
  vint4 ai_14;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar94;
  float fVar99;
  float fVar100;
  vint4 bi_12;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  vfloat4 a0;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  vint4 ai;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  vint4 ai_1;
  undefined1 auVar117 [16];
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  vint4 ai_3;
  undefined1 auVar122 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined1 local_1968 [8];
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar37 = (bvh->root).ptr;
  if (sVar37 != 8) {
    auVar63 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar51 = vpcmpeqd_avx(auVar63,(undefined1  [16])valid_i->field_0);
    auVar63 = *(undefined1 (*) [16])(ray + 0x80);
    auVar50 = ZEXT816(0) << 0x40;
    auVar52 = vcmpps_avx(auVar63,auVar50,5);
    auVar52 = vandps_avx(auVar52,auVar51);
    uVar34 = vmovmskps_avx(auVar52);
    if (uVar34 != 0) {
      uVar35 = (ulong)(uVar34 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar81._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar81._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar81._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar81._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar51 = vrsqrtps_avx(auVar81);
      fVar85 = auVar51._0_4_;
      fVar90 = auVar51._4_4_;
      fVar57 = auVar51._8_4_;
      fVar64 = auVar51._12_4_;
      pre.depth_scale.field_0.v[0] = fVar85 * 1.5 + fVar85 * fVar85 * fVar85 * auVar81._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar90 * 1.5 + fVar90 * fVar90 * fVar90 * auVar81._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar81._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar64 * 1.5 + fVar64 * fVar64 * fVar64 * auVar81._12_4_ * -0.5
      ;
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      do {
        lVar36 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
          }
        }
        auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar36 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar36 * 4 + 0x50)),0x1c);
        auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + lVar36 * 4 + 0x60)),0x28);
        fVar85 = *(float *)((long)pre.ray_space + lVar36 * 4 + -0x10);
        auVar107._0_4_ = auVar81._0_4_ * fVar85;
        auVar107._4_4_ = auVar81._4_4_ * fVar85;
        auVar107._8_4_ = auVar81._8_4_ * fVar85;
        auVar107._12_4_ = auVar81._12_4_ * fVar85;
        auVar102 = vshufpd_avx(auVar107,auVar107,1);
        auVar81 = vmovshdup_avx(auVar107);
        auVar111._0_4_ = auVar81._0_4_ ^ 0x80000000;
        auVar81 = vunpckhps_avx(auVar107,auVar50);
        auVar111._4_12_ = ZEXT812(0) << 0x20;
        auVar110 = vshufps_avx(auVar81,auVar111,0x41);
        auVar109._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
        auVar109._8_8_ = auVar102._8_8_ ^ auVar51._8_8_;
        auVar109 = vinsertps_avx(auVar109,auVar107,0x2a);
        auVar81 = vdpps_avx(auVar110,auVar110,0x7f);
        auVar102 = vdpps_avx(auVar109,auVar109,0x7f);
        auVar81 = vcmpps_avx(auVar102,auVar81,1);
        auVar81 = vshufps_avx(auVar81,auVar81,0);
        auVar81 = vblendvps_avx(auVar109,auVar110,auVar81);
        auVar102 = vdpps_avx(auVar81,auVar81,0x7f);
        auVar109 = vrsqrtss_avx(auVar102,auVar102);
        fVar90 = auVar109._0_4_;
        auVar102 = ZEXT416((uint)(fVar90 * 1.5 - auVar102._0_4_ * 0.5 * fVar90 * fVar90 * fVar90));
        auVar102 = vshufps_avx(auVar102,auVar102,0);
        auVar110._0_4_ = auVar81._0_4_ * auVar102._0_4_;
        auVar110._4_4_ = auVar81._4_4_ * auVar102._4_4_;
        auVar110._8_4_ = auVar81._8_4_ * auVar102._8_4_;
        auVar110._12_4_ = auVar81._12_4_ * auVar102._12_4_;
        auVar81 = vshufps_avx(auVar110,auVar110,0xc9);
        auVar102 = vshufps_avx(auVar107,auVar107,0xc9);
        auVar114._0_4_ = auVar102._0_4_ * auVar110._0_4_;
        auVar114._4_4_ = auVar102._4_4_ * auVar110._4_4_;
        auVar114._8_4_ = auVar102._8_4_ * auVar110._8_4_;
        auVar114._12_4_ = auVar102._12_4_ * auVar110._12_4_;
        auVar112._0_4_ = auVar107._0_4_ * auVar81._0_4_;
        auVar112._4_4_ = auVar107._4_4_ * auVar81._4_4_;
        auVar112._8_4_ = auVar107._8_4_ * auVar81._8_4_;
        auVar112._12_4_ = auVar107._12_4_ * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar112,auVar114);
        auVar109 = vshufps_avx(auVar81,auVar81,0xc9);
        auVar81 = vdpps_avx(auVar109,auVar109,0x7f);
        auVar102 = vrsqrtss_avx(auVar81,auVar81);
        fVar90 = auVar102._0_4_;
        auVar81 = ZEXT416((uint)(fVar90 * 1.5 - auVar81._0_4_ * 0.5 * fVar90 * fVar90 * fVar90));
        auVar81 = vshufps_avx(auVar81,auVar81,0);
        auVar113._0_4_ = auVar81._0_4_ * auVar109._0_4_;
        auVar113._4_4_ = auVar81._4_4_ * auVar109._4_4_;
        auVar113._8_4_ = auVar81._8_4_ * auVar109._8_4_;
        auVar113._12_4_ = auVar81._12_4_ * auVar109._12_4_;
        auVar102._0_4_ = fVar85 * auVar107._0_4_;
        auVar102._4_4_ = fVar85 * auVar107._4_4_;
        auVar102._8_4_ = fVar85 * auVar107._8_4_;
        auVar102._12_4_ = fVar85 * auVar107._12_4_;
        auVar109 = vunpcklps_avx(auVar110,auVar102);
        auVar81 = vunpckhps_avx(auVar110,auVar102);
        auVar110 = vunpcklps_avx(auVar113,auVar50);
        auVar102 = vunpckhps_avx(auVar113,auVar50);
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar81,auVar102);
        aVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar109,auVar110);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar109,auVar110);
        pre.ray_space[lVar36].vx.field_0 = aVar17;
        pre.ray_space[lVar36].vy.field_0 = aVar15;
        pre.ray_space[lVar36].vz.field_0 = aVar16;
        uVar35 = uVar35 & uVar35 - 1;
      } while (uVar35 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      tray.org.field_0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      tray.org.field_0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      tray.org.field_0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar87);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar51,auVar95,1);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar102 = vdivps_avx(auVar103,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar51 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar87);
      auVar81 = vcmpps_avx(auVar51,auVar95,1);
      auVar109 = vdivps_avx(auVar103,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar87);
      auVar51 = vcmpps_avx(auVar51,auVar95,1);
      auVar110 = vdivps_avx(auVar103,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar96._8_4_ = 0x5d5e0b6b;
      auVar96._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar96._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar102,auVar96,auVar50);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar109,auVar96,auVar81);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar110,auVar96,auVar51);
      auVar50 = ZEXT816(0) << 0x20;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar50,1);
      auVar74._8_4_ = 0x10;
      auVar74._0_8_ = 0x1000000010;
      auVar74._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar51,auVar74);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar50,5);
      auVar75._8_4_ = 0x20;
      auVar75._0_8_ = 0x2000000020;
      auVar75._12_4_ = 0x20;
      auVar82._8_4_ = 0x30;
      auVar82._0_8_ = 0x3000000030;
      auVar82._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar82,auVar75,auVar51);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar50,5);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar67._8_4_ = 0x50;
      auVar67._0_8_ = 0x5000000050;
      auVar67._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar67,auVar58,auVar51);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar50);
      auVar63 = vmaxps_avx(auVar63,auVar50);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar106 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar51,auVar52);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar63,auVar52);
      auVar63 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar52._4_4_ ^ auVar63._4_4_;
      terminated.field_0.i[0] = auVar52._0_4_ ^ auVar63._0_4_;
      terminated.field_0.i[2] = auVar52._8_4_ ^ auVar63._8_4_;
      terminated.field_0.i[3] = auVar52._12_4_ ^ auVar63._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar37;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00304c0e:
      do {
        do {
          root.ptr = pNVar39[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_003053fb;
          pNVar39 = pNVar39 + -1;
          paVar38 = paVar38 + -1;
          vVar12.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar38->v;
          auVar53 = ZEXT1664((undefined1  [16])vVar12.field_0);
          auVar63 = vcmpps_avx((undefined1  [16])vVar12.field_0,(undefined1  [16])tray.tfar.field_0,
                               1);
          uVar31 = vmovmskps_avx(auVar63);
        } while (uVar31 == 0);
        uVar35 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        if (uVar34 < uVar31) {
LAB_00304c4c:
          do {
            vVar28.field_0 = terminated.field_0;
            iVar33 = 4;
            lVar36 = -0x10;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003053fb;
              auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar53._0_16_,6);
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                bVar13 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar14 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar27;
                valid_o.field_0._0_8_ = uVar26;
                uVar31 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar31 ^ 0xf) != 0) {
                  uVar35 = (ulong)((uVar31 ^ 0xf) & 0xff);
                  do {
                    lVar36 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    cVar29 = (**(code **)((long)pvVar14 + (ulong)bVar13 * 0x40 + 0x18))
                                       (&pre,ray,lVar36,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar29 != '\0') {
                      valid_o.field_0.i[lVar36] = -1;
                    }
                    uVar35 = uVar35 & uVar35 - 1;
                  } while (uVar35 != 0);
                  auVar106 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar28.field_0);
                auVar63 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar63[0xf]) goto LAB_003053fb;
                auVar62._8_4_ = 0xff800000;
                auVar62._0_8_ = 0xff800000ff800000;
                auVar62._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar62,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00304c0e;
            }
            uVar35 = root.ptr & 0xfffffffffffffff0;
            uVar31 = (uint)root.ptr & 7;
            auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar53._0_16_,6);
            auVar51 = auVar106._0_16_;
            sVar37 = 8;
            do {
              root.ptr = *(size_t *)(uVar35 + 0x20 + lVar36 * 2);
              if (root.ptr == 8) {
                auVar53 = ZEXT1664(auVar51);
                root.ptr = sVar37;
                break;
              }
              if ((uVar31 == 6) || (uVar31 == 1)) {
                fVar85 = *(float *)(uVar35 + 0x90 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x30 + lVar36);
                auVar50 = *(undefined1 (*) [16])(ray + 0x70);
                fVar57 = auVar50._0_4_;
                fVar64 = auVar50._4_4_;
                fVar65 = auVar50._8_4_;
                fVar66 = auVar50._12_4_;
                auVar40._0_4_ = fVar57 * fVar85 + fVar90;
                auVar40._4_4_ = fVar64 * fVar85 + fVar90;
                auVar40._8_4_ = fVar65 * fVar85 + fVar90;
                auVar40._12_4_ = fVar66 * fVar85 + fVar90;
                fVar85 = *(float *)(uVar35 + 0xb0 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x50 + lVar36);
                auVar45._0_4_ = fVar57 * fVar85 + fVar90;
                auVar45._4_4_ = fVar64 * fVar85 + fVar90;
                auVar45._8_4_ = fVar65 * fVar85 + fVar90;
                auVar45._12_4_ = fVar66 * fVar85 + fVar90;
                fVar85 = *(float *)(uVar35 + 0xd0 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x70 + lVar36);
                auVar68._0_4_ = fVar57 * fVar85 + fVar90;
                auVar68._4_4_ = fVar64 * fVar85 + fVar90;
                auVar68._8_4_ = fVar65 * fVar85 + fVar90;
                auVar68._12_4_ = fVar66 * fVar85 + fVar90;
                fVar85 = *(float *)(uVar35 + 0xa0 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x40 + lVar36);
                auVar76._0_4_ = fVar57 * fVar85 + fVar90;
                auVar76._4_4_ = fVar64 * fVar85 + fVar90;
                auVar76._8_4_ = fVar65 * fVar85 + fVar90;
                auVar76._12_4_ = fVar66 * fVar85 + fVar90;
                fVar85 = *(float *)(uVar35 + 0xc0 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x60 + lVar36);
                auVar83._0_4_ = fVar57 * fVar85 + fVar90;
                auVar83._4_4_ = fVar64 * fVar85 + fVar90;
                auVar83._8_4_ = fVar65 * fVar85 + fVar90;
                auVar83._12_4_ = fVar66 * fVar85 + fVar90;
                fVar85 = *(float *)(uVar35 + 0xe0 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x80 + lVar36);
                auVar88._0_4_ = fVar57 * fVar85 + fVar90;
                auVar88._4_4_ = fVar64 * fVar85 + fVar90;
                auVar88._8_4_ = fVar65 * fVar85 + fVar90;
                auVar88._12_4_ = fVar66 * fVar85 + fVar90;
                auVar19._4_4_ = tray.org.field_0._4_4_;
                auVar19._0_4_ = tray.org.field_0._0_4_;
                auVar19._8_4_ = tray.org.field_0._8_4_;
                auVar19._12_4_ = tray.org.field_0._12_4_;
                auVar20._4_4_ = tray.org.field_0._20_4_;
                auVar20._0_4_ = tray.org.field_0._16_4_;
                auVar20._8_4_ = tray.org.field_0._24_4_;
                auVar20._12_4_ = tray.org.field_0._28_4_;
                auVar21._4_4_ = tray.org.field_0._36_4_;
                auVar21._0_4_ = tray.org.field_0._32_4_;
                auVar21._8_4_ = tray.org.field_0._40_4_;
                auVar21._12_4_ = tray.org.field_0._44_4_;
                auVar81 = vsubps_avx(auVar40,auVar19);
                auVar115._0_4_ = tray.rdir.field_0._0_4_ * auVar81._0_4_;
                auVar115._4_4_ = tray.rdir.field_0._4_4_ * auVar81._4_4_;
                auVar115._8_4_ = tray.rdir.field_0._8_4_ * auVar81._8_4_;
                auVar115._12_4_ = tray.rdir.field_0._12_4_ * auVar81._12_4_;
                auVar81 = vsubps_avx(auVar45,auVar20);
                auVar117._0_4_ = auVar81._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar117._4_4_ = auVar81._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar117._8_4_ = auVar81._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar117._12_4_ = auVar81._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar81 = vsubps_avx(auVar68,auVar21);
                auVar122._0_4_ = auVar81._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar122._4_4_ = auVar81._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar122._8_4_ = auVar81._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar122._12_4_ = auVar81._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar81 = vsubps_avx(auVar76,auVar19);
                auVar77._0_4_ = tray.rdir.field_0._0_4_ * auVar81._0_4_;
                auVar77._4_4_ = tray.rdir.field_0._4_4_ * auVar81._4_4_;
                auVar77._8_4_ = tray.rdir.field_0._8_4_ * auVar81._8_4_;
                auVar77._12_4_ = tray.rdir.field_0._12_4_ * auVar81._12_4_;
                auVar81 = vsubps_avx(auVar83,auVar20);
                auVar46._0_4_ = auVar81._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar46._4_4_ = auVar81._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar46._8_4_ = auVar81._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar46._12_4_ = auVar81._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar81 = vsubps_avx(auVar88,auVar21);
                auVar69._0_4_ = auVar81._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar69._4_4_ = auVar81._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar69._8_4_ = auVar81._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar69._12_4_ = auVar81._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar81 = vpminsd_avx(auVar115,auVar77);
                auVar102 = vpminsd_avx(auVar117,auVar46);
                auVar81 = vpmaxsd_avx(auVar81,auVar102);
                auVar102 = vpminsd_avx(auVar122,auVar69);
                auVar81 = vpmaxsd_avx(auVar81,auVar102);
                auVar41._0_4_ = auVar81._0_4_ * 0.99999964;
                auVar41._4_4_ = auVar81._4_4_ * 0.99999964;
                auVar41._8_4_ = auVar81._8_4_ * 0.99999964;
                auVar41._12_4_ = auVar81._12_4_ * 0.99999964;
                auVar81 = vpmaxsd_avx(auVar115,auVar77);
                auVar102 = vpmaxsd_avx(auVar117,auVar46);
                auVar102 = vpminsd_avx(auVar81,auVar102);
                auVar81 = vpmaxsd_avx(auVar122,auVar69);
                auVar102 = vpminsd_avx(auVar102,auVar81);
                auVar81 = vpmaxsd_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
                auVar70._0_4_ = auVar102._0_4_ * 1.0000004;
                auVar70._4_4_ = auVar102._4_4_ * 1.0000004;
                auVar70._8_4_ = auVar102._8_4_ * 1.0000004;
                auVar70._12_4_ = auVar102._12_4_ * 1.0000004;
                auVar102 = vpminsd_avx(auVar70,(undefined1  [16])tray.tfar.field_0);
                auVar81 = vcmpps_avx(auVar81,auVar102,2);
                if (uVar31 == 6) {
                  uVar32 = *(undefined4 *)(uVar35 + 0xf0 + lVar36);
                  auVar71._4_4_ = uVar32;
                  auVar71._0_4_ = uVar32;
                  auVar71._8_4_ = uVar32;
                  auVar71._12_4_ = uVar32;
                  auVar102 = vcmpps_avx(auVar71,auVar50,2);
                  uVar32 = *(undefined4 *)(uVar35 + 0x100 + lVar36);
                  auVar78._4_4_ = uVar32;
                  auVar78._0_4_ = uVar32;
                  auVar78._8_4_ = uVar32;
                  auVar78._12_4_ = uVar32;
                  auVar50 = vcmpps_avx(auVar50,auVar78,1);
                  auVar50 = vandps_avx(auVar102,auVar50);
                  auVar81 = vandps_avx(auVar50,auVar81);
                }
              }
              else {
                fVar85 = *(float *)(uVar35 + 0x60 + lVar36);
                fVar90 = *(float *)(uVar35 + 0x70 + lVar36);
                fVar57 = *(float *)(uVar35 + 0x80 + lVar36);
                fVar64 = *(float *)(uVar35 + 0x90 + lVar36);
                fVar65 = *(float *)(uVar35 + 0xa0 + lVar36);
                fVar66 = *(float *)(uVar35 + 0xf0 + lVar36);
                fVar1 = *(float *)(uVar35 + 0x100 + lVar36);
                fVar2 = *(float *)(uVar35 + 0x110 + lVar36);
                fVar3 = *(float *)(uVar35 + 0x120 + lVar36);
                fVar4 = *(float *)(uVar35 + 0x130 + lVar36);
                fVar5 = *(float *)(uVar35 + 0x140 + lVar36);
                auVar50 = *(undefined1 (*) [16])(ray + 0x70);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar81 = vsubps_avx(auVar72,auVar50);
                fVar116 = auVar50._0_4_;
                fVar118 = auVar50._4_4_;
                fVar119 = auVar50._8_4_;
                fVar120 = auVar50._12_4_;
                fVar121 = auVar81._0_4_;
                fVar126 = fVar121 * 0.0;
                fVar123 = auVar81._4_4_;
                fVar127 = fVar123 * 0.0;
                fVar124 = auVar81._8_4_;
                fVar128 = fVar124 * 0.0;
                fVar125 = auVar81._12_4_;
                fVar129 = fVar125 * 0.0;
                local_1968._4_4_ = fVar127 + fVar118 * fVar2;
                local_1968._0_4_ = fVar126 + fVar116 * fVar2;
                fStack_1960 = fVar128 + fVar119 * fVar2;
                fStack_195c = fVar129 + fVar120 * fVar2;
                fVar2 = *(float *)(uVar35 + 0xb0 + lVar36);
                fVar6 = *(float *)(uVar35 + 0x30 + lVar36);
                auVar104._0_4_ =
                     fVar6 * (float)tray.dir.field_0._0_4_ +
                     fVar85 * (float)tray.dir.field_0._16_4_ +
                     fVar64 * (float)tray.dir.field_0._32_4_;
                auVar104._4_4_ =
                     fVar6 * (float)tray.dir.field_0._4_4_ +
                     fVar85 * (float)tray.dir.field_0._20_4_ +
                     fVar64 * (float)tray.dir.field_0._36_4_;
                auVar104._8_4_ =
                     fVar6 * (float)tray.dir.field_0._8_4_ +
                     fVar85 * (float)tray.dir.field_0._24_4_ +
                     fVar64 * (float)tray.dir.field_0._40_4_;
                auVar104._12_4_ =
                     fVar6 * (float)tray.dir.field_0._12_4_ +
                     fVar85 * (float)tray.dir.field_0._28_4_ +
                     fVar64 * (float)tray.dir.field_0._44_4_;
                fVar7 = *(float *)(uVar35 + 0x40 + lVar36);
                auVar97._0_4_ =
                     fVar7 * (float)tray.dir.field_0._0_4_ +
                     fVar90 * (float)tray.dir.field_0._16_4_ +
                     fVar65 * (float)tray.dir.field_0._32_4_;
                auVar97._4_4_ =
                     fVar7 * (float)tray.dir.field_0._4_4_ +
                     fVar90 * (float)tray.dir.field_0._20_4_ +
                     fVar65 * (float)tray.dir.field_0._36_4_;
                auVar97._8_4_ =
                     fVar7 * (float)tray.dir.field_0._8_4_ +
                     fVar90 * (float)tray.dir.field_0._24_4_ +
                     fVar65 * (float)tray.dir.field_0._40_4_;
                auVar97._12_4_ =
                     fVar7 * (float)tray.dir.field_0._12_4_ +
                     fVar90 * (float)tray.dir.field_0._28_4_ +
                     fVar65 * (float)tray.dir.field_0._44_4_;
                fVar8 = *(float *)(uVar35 + 0x50 + lVar36);
                auVar47._0_4_ =
                     fVar8 * (float)tray.dir.field_0._0_4_ +
                     fVar57 * (float)tray.dir.field_0._16_4_ +
                     fVar2 * (float)tray.dir.field_0._32_4_;
                auVar47._4_4_ =
                     fVar8 * (float)tray.dir.field_0._4_4_ +
                     fVar57 * (float)tray.dir.field_0._20_4_ +
                     fVar2 * (float)tray.dir.field_0._36_4_;
                auVar47._8_4_ =
                     fVar8 * (float)tray.dir.field_0._8_4_ +
                     fVar57 * (float)tray.dir.field_0._24_4_ +
                     fVar2 * (float)tray.dir.field_0._40_4_;
                auVar47._12_4_ =
                     fVar8 * (float)tray.dir.field_0._12_4_ +
                     fVar57 * (float)tray.dir.field_0._28_4_ +
                     fVar2 * (float)tray.dir.field_0._44_4_;
                auVar59._8_4_ = 0x7fffffff;
                auVar59._0_8_ = 0x7fffffff7fffffff;
                auVar59._12_4_ = 0x7fffffff;
                auVar50 = vandps_avx(auVar104,auVar59);
                auVar108._8_4_ = 0x219392ef;
                auVar108._0_8_ = 0x219392ef219392ef;
                auVar108._12_4_ = 0x219392ef;
                auVar50 = vcmpps_avx(auVar50,auVar108,1);
                auVar81 = vblendvps_avx(auVar104,auVar108,auVar50);
                auVar50 = vandps_avx(auVar97,auVar59);
                auVar50 = vcmpps_avx(auVar50,auVar108,1);
                auVar102 = vblendvps_avx(auVar97,auVar108,auVar50);
                auVar50 = vandps_avx(auVar47,auVar59);
                auVar50 = vcmpps_avx(auVar50,auVar108,1);
                auVar50 = vblendvps_avx(auVar47,auVar108,auVar50);
                auVar109 = vrcpps_avx(auVar81);
                fVar44 = auVar109._0_4_;
                auVar89._0_4_ = fVar44 * auVar81._0_4_;
                fVar54 = auVar109._4_4_;
                auVar89._4_4_ = fVar54 * auVar81._4_4_;
                fVar55 = auVar109._8_4_;
                auVar89._8_4_ = fVar55 * auVar81._8_4_;
                fVar56 = auVar109._12_4_;
                auVar89._12_4_ = fVar56 * auVar81._12_4_;
                auVar81 = vsubps_avx(auVar72,auVar89);
                fVar44 = fVar44 + fVar44 * auVar81._0_4_;
                fVar54 = fVar54 + fVar54 * auVar81._4_4_;
                fVar55 = fVar55 + fVar55 * auVar81._8_4_;
                fVar56 = fVar56 + fVar56 * auVar81._12_4_;
                auVar81 = vrcpps_avx(auVar102);
                fVar86 = auVar81._0_4_;
                auVar98._0_4_ = fVar86 * auVar102._0_4_;
                fVar91 = auVar81._4_4_;
                auVar98._4_4_ = fVar91 * auVar102._4_4_;
                fVar92 = auVar81._8_4_;
                auVar98._8_4_ = fVar92 * auVar102._8_4_;
                fVar93 = auVar81._12_4_;
                auVar98._12_4_ = fVar93 * auVar102._12_4_;
                auVar81 = vsubps_avx(auVar72,auVar98);
                fVar86 = fVar86 + fVar86 * auVar81._0_4_;
                fVar91 = fVar91 + fVar91 * auVar81._4_4_;
                fVar92 = fVar92 + fVar92 * auVar81._8_4_;
                fVar93 = fVar93 + fVar93 * auVar81._12_4_;
                auVar81 = vrcpps_avx(auVar50);
                fVar94 = auVar81._0_4_;
                auVar105._0_4_ = auVar50._0_4_ * fVar94;
                fVar99 = auVar81._4_4_;
                auVar105._4_4_ = auVar50._4_4_ * fVar99;
                fVar100 = auVar81._8_4_;
                auVar105._8_4_ = auVar50._8_4_ * fVar100;
                fVar101 = auVar81._12_4_;
                auVar105._12_4_ = auVar50._12_4_ * fVar101;
                auVar50 = vsubps_avx(auVar72,auVar105);
                fVar94 = auVar50._0_4_ * fVar94 + fVar94;
                fVar99 = auVar50._4_4_ * fVar99 + fVar99;
                fVar100 = auVar50._8_4_ * fVar100 + fVar100;
                fVar101 = auVar50._12_4_ * fVar101 + fVar101;
                fVar9 = *(float *)(uVar35 + 0xc0 + lVar36);
                fVar10 = *(float *)(uVar35 + 0xd0 + lVar36);
                fVar11 = *(float *)(uVar35 + 0xe0 + lVar36);
                auVar106 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar60._0_4_ =
                     fVar6 * (float)tray.org.field_0._0_4_ +
                     (float)tray.org.field_0._16_4_ * fVar85 +
                     fVar64 * (float)tray.org.field_0._32_4_ + fVar9;
                auVar60._4_4_ =
                     fVar6 * (float)tray.org.field_0._4_4_ +
                     (float)tray.org.field_0._20_4_ * fVar85 +
                     fVar64 * (float)tray.org.field_0._36_4_ + fVar9;
                auVar60._8_4_ =
                     fVar6 * (float)tray.org.field_0._8_4_ +
                     (float)tray.org.field_0._24_4_ * fVar85 +
                     fVar64 * (float)tray.org.field_0._40_4_ + fVar9;
                auVar60._12_4_ =
                     fVar6 * (float)tray.org.field_0._12_4_ +
                     (float)tray.org.field_0._28_4_ * fVar85 +
                     fVar64 * (float)tray.org.field_0._44_4_ + fVar9;
                auVar79._0_4_ =
                     fVar7 * (float)tray.org.field_0._0_4_ +
                     fVar10 + fVar65 * (float)tray.org.field_0._32_4_ +
                     (float)tray.org.field_0._16_4_ * fVar90;
                auVar79._4_4_ =
                     fVar7 * (float)tray.org.field_0._4_4_ +
                     fVar10 + fVar65 * (float)tray.org.field_0._36_4_ +
                     (float)tray.org.field_0._20_4_ * fVar90;
                auVar79._8_4_ =
                     fVar7 * (float)tray.org.field_0._8_4_ +
                     fVar10 + fVar65 * (float)tray.org.field_0._40_4_ +
                     (float)tray.org.field_0._24_4_ * fVar90;
                auVar79._12_4_ =
                     fVar7 * (float)tray.org.field_0._12_4_ +
                     fVar10 + fVar65 * (float)tray.org.field_0._44_4_ +
                     (float)tray.org.field_0._28_4_ * fVar90;
                auVar42._0_4_ =
                     fVar8 * (float)tray.org.field_0._0_4_ +
                     fVar57 * (float)tray.org.field_0._16_4_ +
                     fVar11 + (float)tray.org.field_0._32_4_ * fVar2;
                auVar42._4_4_ =
                     fVar8 * (float)tray.org.field_0._4_4_ +
                     fVar57 * (float)tray.org.field_0._20_4_ +
                     fVar11 + (float)tray.org.field_0._36_4_ * fVar2;
                auVar42._8_4_ =
                     fVar8 * (float)tray.org.field_0._8_4_ +
                     fVar57 * (float)tray.org.field_0._24_4_ +
                     fVar11 + (float)tray.org.field_0._40_4_ * fVar2;
                auVar42._12_4_ =
                     fVar8 * (float)tray.org.field_0._12_4_ +
                     fVar57 * (float)tray.org.field_0._28_4_ +
                     fVar11 + (float)tray.org.field_0._44_4_ * fVar2;
                auVar23._4_4_ = fVar127 + fVar118 * fVar66;
                auVar23._0_4_ = fVar126 + fVar116 * fVar66;
                auVar23._8_4_ = fVar128 + fVar119 * fVar66;
                auVar23._12_4_ = fVar129 + fVar120 * fVar66;
                auVar50 = vsubps_avx(auVar23,auVar60);
                auVar22._4_4_ = fVar123 + fVar118 * fVar3;
                auVar22._0_4_ = fVar121 + fVar116 * fVar3;
                auVar22._8_4_ = fVar124 + fVar119 * fVar3;
                auVar22._12_4_ = fVar125 + fVar120 * fVar3;
                auVar81 = vsubps_avx(auVar22,auVar60);
                auVar73._0_4_ = fVar44 * auVar50._0_4_;
                auVar73._4_4_ = fVar54 * auVar50._4_4_;
                auVar73._8_4_ = fVar55 * auVar50._8_4_;
                auVar73._12_4_ = fVar56 * auVar50._12_4_;
                auVar48._0_4_ = fVar44 * auVar81._0_4_;
                auVar48._4_4_ = fVar54 * auVar81._4_4_;
                auVar48._8_4_ = fVar55 * auVar81._8_4_;
                auVar48._12_4_ = fVar56 * auVar81._12_4_;
                auVar18._4_4_ = fVar127 + fVar118 * fVar1;
                auVar18._0_4_ = fVar126 + fVar116 * fVar1;
                auVar18._8_4_ = fVar128 + fVar119 * fVar1;
                auVar18._12_4_ = fVar129 + fVar120 * fVar1;
                auVar50 = vsubps_avx(auVar18,auVar79);
                auVar24._4_4_ = fVar123 + fVar118 * fVar4;
                auVar24._0_4_ = fVar121 + fVar116 * fVar4;
                auVar24._8_4_ = fVar124 + fVar119 * fVar4;
                auVar24._12_4_ = fVar125 + fVar120 * fVar4;
                auVar81 = vsubps_avx(auVar24,auVar79);
                auVar61._0_4_ = fVar86 * auVar50._0_4_;
                auVar61._4_4_ = fVar91 * auVar50._4_4_;
                auVar61._8_4_ = fVar92 * auVar50._8_4_;
                auVar61._12_4_ = fVar93 * auVar50._12_4_;
                auVar80._0_4_ = fVar86 * auVar81._0_4_;
                auVar80._4_4_ = fVar91 * auVar81._4_4_;
                auVar80._8_4_ = fVar92 * auVar81._8_4_;
                auVar80._12_4_ = fVar93 * auVar81._12_4_;
                auVar50 = vsubps_avx(_local_1968,auVar42);
                auVar84._0_4_ = fVar94 * auVar50._0_4_;
                auVar84._4_4_ = fVar99 * auVar50._4_4_;
                auVar84._8_4_ = fVar100 * auVar50._8_4_;
                auVar84._12_4_ = fVar101 * auVar50._12_4_;
                auVar25._4_4_ = fVar123 + fVar118 * fVar5;
                auVar25._0_4_ = fVar121 + fVar116 * fVar5;
                auVar25._8_4_ = fVar124 + fVar119 * fVar5;
                auVar25._12_4_ = fVar125 + fVar120 * fVar5;
                auVar50 = vsubps_avx(auVar25,auVar42);
                auVar43._0_4_ = fVar94 * auVar50._0_4_;
                auVar43._4_4_ = fVar99 * auVar50._4_4_;
                auVar43._8_4_ = fVar100 * auVar50._8_4_;
                auVar43._12_4_ = fVar101 * auVar50._12_4_;
                auVar50 = vpminsd_avx(auVar73,auVar48);
                auVar81 = vpminsd_avx(auVar61,auVar80);
                auVar50 = vpmaxsd_avx(auVar50,auVar81);
                auVar81 = vpminsd_avx(auVar84,auVar43);
                auVar50 = vpmaxsd_avx(auVar50,auVar81);
                auVar81 = vpmaxsd_avx(auVar73,auVar48);
                auVar102 = vpmaxsd_avx(auVar61,auVar80);
                auVar102 = vpminsd_avx(auVar81,auVar102);
                auVar81 = vpmaxsd_avx(auVar84,auVar43);
                auVar81 = vpminsd_avx(auVar102,auVar81);
                auVar41._0_4_ = auVar50._0_4_ * 0.99999964;
                auVar41._4_4_ = auVar50._4_4_ * 0.99999964;
                auVar41._8_4_ = auVar50._8_4_ * 0.99999964;
                auVar41._12_4_ = auVar50._12_4_ * 0.99999964;
                auVar50 = vpmaxsd_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
                auVar49._0_4_ = auVar81._0_4_ * 1.0000004;
                auVar49._4_4_ = auVar81._4_4_ * 1.0000004;
                auVar49._8_4_ = auVar81._8_4_ * 1.0000004;
                auVar49._12_4_ = auVar81._12_4_ * 1.0000004;
                auVar81 = vpminsd_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
                auVar81 = vcmpps_avx(auVar50,auVar81,2);
              }
              auVar50 = vandps_avx(auVar81,auVar63);
              auVar50 = vpslld_avx(auVar50,0x1f);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) {
                auVar53 = ZEXT1664(auVar51);
                root.ptr = sVar37;
              }
              else {
                auVar50 = vblendvps_avx(auVar106._0_16_,auVar41,auVar50);
                auVar53 = ZEXT1664(auVar50);
                if (sVar37 != 8) {
                  pNVar39->ptr = sVar37;
                  pNVar39 = pNVar39 + 1;
                  local_1978 = auVar51._0_8_;
                  uStack_1970 = auVar51._8_8_;
                  *(undefined8 *)paVar38 = local_1978;
                  *(undefined8 *)(paVar38->v + 2) = uStack_1970;
                  paVar38 = paVar38 + 1;
                }
              }
              auVar51 = auVar53._0_16_;
              lVar36 = lVar36 + 4;
              sVar37 = root.ptr;
            } while (lVar36 != 0);
            if (root.ptr == 8) goto LAB_003051ff;
            auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar53._0_16_,6);
            uVar32 = vmovmskps_avx(auVar63);
          } while ((byte)uVar34 < (byte)POPCOUNT(uVar32));
          pNVar39->ptr = root.ptr;
          pNVar39 = pNVar39 + 1;
          *paVar38 = auVar53._0_16_;
          paVar38 = paVar38 + 1;
        }
        else {
          do {
            sVar37 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> sVar37 & 1) == 0; sVar37 = sVar37 + 1) {
              }
            }
            bVar30 = occluded1(This,bvh,root,sVar37,&pre,ray,&tray,context);
            if (bVar30) {
              terminated.field_0.i[sVar37] = -1;
            }
            uVar35 = uVar35 & uVar35 - 1;
          } while (uVar35 != 0);
          auVar63 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar33 = 3;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar63._8_4_ = 0xff800000;
            auVar63._0_8_ = 0xff800000ff800000;
            auVar63._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar63,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          auVar106 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar53 = ZEXT1664((undefined1  [16])vVar12.field_0);
          if (uVar34 < uVar31) goto LAB_00304c4c;
        }
LAB_003051ff:
      } while (iVar33 != 3);
LAB_003053fb:
      auVar63 = vandps_avx(auVar52,(undefined1  [16])terminated.field_0);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar63 = vmaskmovps_avx(auVar63,auVar52);
      *(undefined1 (*) [16])(ray + 0x80) = auVar63;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }